

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

int Sfm_LibFindComplInputGate(Vec_Wrd_t *vFuncs,int iGate,int nFanins,int iFanin,int *piFaninNew)

{
  word wVar1;
  word wVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  
  wVar1 = Vec_WrdEntry(vFuncs,iGate);
  uVar4 = s_Truths6[iFanin];
  bVar3 = (byte)(1 << ((byte)iFanin & 0x1f));
  if ((-1 < iFanin) && (iFanin < nFanins)) {
    if (piFaninNew != (int *)0x0) {
      *piFaninNew = iFanin;
    }
    uVar4 = (uVar4 & wVar1) >> (bVar3 & 0x3f) | uVar4 & wVar1 << (bVar3 & 0x3f);
    for (iVar5 = 0; iVar5 < vFuncs->nSize; iVar5 = iVar5 + 1) {
      wVar1 = Vec_WrdEntry(vFuncs,iVar5);
      if (wVar1 == uVar4) {
        return iVar5;
      }
    }
    if (iFanin != 0) {
      if (piFaninNew != (int *)0x0) {
        *piFaninNew = iFanin + -1;
      }
      wVar1 = Abc_Tt6SwapAdjacent(uVar4,iFanin + -1);
      for (iVar5 = 0; iVar5 < vFuncs->nSize; iVar5 = iVar5 + 1) {
        wVar2 = Vec_WrdEntry(vFuncs,iVar5);
        if (wVar2 == wVar1) {
          return iVar5;
        }
      }
    }
    if (iFanin + 1 < nFanins) {
      if (piFaninNew != (int *)0x0) {
        *piFaninNew = iFanin + 1;
      }
      wVar1 = Abc_Tt6SwapAdjacent(uVar4,iFanin);
      for (iVar5 = 0; iVar5 < vFuncs->nSize; iVar5 = iVar5 + 1) {
        wVar2 = Vec_WrdEntry(vFuncs,iVar5);
        if (wVar2 == wVar1) {
          return iVar5;
        }
      }
    }
    if (piFaninNew != (int *)0x0) {
      *piFaninNew = -1;
    }
    return -1;
  }
  __assert_fail("iFanin >= 0 && iFanin < nFanins",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                ,0xa6,"int Sfm_LibFindComplInputGate(Vec_Wrd_t *, int, int, int, int *)");
}

Assistant:

int Sfm_LibFindComplInputGate( Vec_Wrd_t * vFuncs, int iGate, int nFanins, int iFanin, int * piFaninNew )
{
    word uTruthGate = Vec_WrdEntry( vFuncs, iGate );
    word uTruthFlip = Abc_Tt6Flip( uTruthGate, iFanin ); 
    word uTruth, uTruthSwap;  int i;
    assert( iFanin >= 0 && iFanin < nFanins );
    if ( piFaninNew ) *piFaninNew = iFanin;
    Vec_WrdForEachEntry( vFuncs, uTruth, i )
        if ( uTruth == uTruthFlip )
            return i;
    if ( iFanin-1 >= 0 )
    {
        if ( piFaninNew ) *piFaninNew = iFanin-1;
        uTruthSwap = Abc_Tt6SwapAdjacent( uTruthFlip, iFanin-1 );
        Vec_WrdForEachEntry( vFuncs, uTruth, i )
            if ( uTruth == uTruthSwap )
                return i;
    }
    if ( iFanin+1 < nFanins )
    {
        if ( piFaninNew ) *piFaninNew = iFanin+1;
        uTruthSwap = Abc_Tt6SwapAdjacent( uTruthFlip, iFanin );
        Vec_WrdForEachEntry( vFuncs, uTruth, i )
            if ( uTruth == uTruthSwap )
                return i;
    }
    // add checking for complemeting control input of a MUX
    if ( piFaninNew ) *piFaninNew = -1;
    return -1;
}